

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FkCheck(Parse *pParse,Table *pTab,int regOld,int regNew)

{
  Table *pTVar1;
  int iVar2;
  SrcList *pSrc_00;
  int local_c4;
  SrcList_item *pItem;
  int *aiCol_1;
  SrcList *pSrc;
  Index *pIdx_1;
  char *zCol;
  int local_88;
  int rcauth;
  int iReg;
  int iJump;
  Vdbe *v;
  int local_70;
  int isIgnore;
  int i;
  int iCol;
  int *aiCol;
  int *aiFree;
  Index *pIdx;
  Table *pTo;
  char *pcStack_40;
  int isIgnoreErrors;
  char *zDb;
  FKey *pFStack_30;
  int iDb;
  FKey *pFKey;
  sqlite3 *db;
  int regNew_local;
  int regOld_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  pFKey = (FKey *)pParse->db;
  pTo._4_4_ = (uint)pParse->disableTriggers;
  if ((((sqlite3 *)pFKey)->flags & 0x40000U) != 0) {
    db._0_4_ = regNew;
    db._4_4_ = regOld;
    _regNew_local = pTab;
    pTab_local = (Table *)pParse;
    zDb._4_4_ = sqlite3SchemaToIndex((sqlite3 *)pFKey,pTab->pSchema);
    pcStack_40 = *(char **)(pFKey->pPrevTo->aAction + (long)zDb._4_4_ * 0x20 + -0x2d);
    for (pFStack_30 = _regNew_local->pFKey; pFStack_30 != (FKey *)0x0;
        pFStack_30 = pFStack_30->pNextFrom) {
      aiFree = (int *)0x0;
      aiCol = (int *)0x0;
      v._4_4_ = 0;
      if (*(char *)((long)&pTab_local[4].pIndex + 2) == '\0') {
        pIdx = (Index *)sqlite3LocateTable((Parse *)pTab_local,0,pFStack_30->zTo,pcStack_40);
      }
      else {
        pIdx = (Index *)sqlite3FindTable((sqlite3 *)pFKey,pFStack_30->zTo,pcStack_40);
      }
      if ((pIdx == (Index *)0x0) ||
         (iVar2 = sqlite3FkLocateIndex
                            ((Parse *)pTab_local,(Table *)pIdx,pFStack_30,(Index **)&aiFree,&aiCol),
         iVar2 != 0)) {
        if (pTo._4_4_ == 0) {
          return;
        }
        if (*(char *)&pFKey[1].pFrom != '\0') {
          return;
        }
        if (pIdx == (Index *)0x0) {
          _iReg = sqlite3GetVdbe((Parse *)pTab_local);
          iVar2 = sqlite3VdbeCurrentAddr(_iReg);
          rcauth = iVar2 + pFStack_30->nCol + 1;
          for (local_70 = 0; local_70 < pFStack_30->nCol; local_70 = local_70 + 1) {
            local_88 = pFStack_30->aCol[local_70].iFrom + db._4_4_ + 1;
            sqlite3VdbeAddOp2(_iReg,0x49,local_88,rcauth);
          }
          sqlite3VdbeAddOp2(_iReg,0x75,(uint)pFStack_30->isDeferred,-1);
        }
      }
      else {
        if (aiCol == (int *)0x0) {
          isIgnore = pFStack_30->aCol[0].iFrom;
          _i = &isIgnore;
        }
        else {
          _i = aiCol;
        }
        for (local_70 = 0; local_70 < pFStack_30->nCol; local_70 = local_70 + 1) {
          if (_i[local_70] == (int)_regNew_local->iPKey) {
            _i[local_70] = -1;
          }
          if (*(long *)pFKey[4].aCol != 0) {
            if (aiFree == (int *)0x0) {
              local_c4 = (int)*(short *)&pIdx->azColl;
            }
            else {
              local_c4 = *(int *)(*(long *)(aiFree + 2) + (long)local_70 * 4);
            }
            pIdx_1 = *(Index **)(pIdx->aiColumn + (long)local_c4 * 0xc);
            zCol._4_4_ = sqlite3AuthReadCol((Parse *)pTab_local,pIdx->zName,(char *)pIdx_1,zDb._4_4_
                                           );
            v._4_4_ = (uint)(zCol._4_4_ == 2);
          }
        }
        sqlite3TableLock((Parse *)pTab_local,zDb._4_4_,*(int *)((long)&pIdx->aSortOrder + 4),'\0',
                         pIdx->zName);
        *(int *)((long)&pTab_local->azModuleArg + 4) =
             *(int *)((long)&pTab_local->azModuleArg + 4) + 1;
        if (db._4_4_ != 0) {
          fkLookupParent((Parse *)pTab_local,zDb._4_4_,(Table *)pIdx,(Index *)aiFree,pFStack_30,_i,
                         db._4_4_,-1,v._4_4_);
        }
        if ((int)db != 0) {
          fkLookupParent((Parse *)pTab_local,zDb._4_4_,(Table *)pIdx,(Index *)aiFree,pFStack_30,_i,
                         (int)db,1,v._4_4_);
        }
        sqlite3DbFree((sqlite3 *)pFKey,aiCol);
      }
    }
    for (pFStack_30 = sqlite3FkReferences(_regNew_local); pFStack_30 != (FKey *)0x0;
        pFStack_30 = pFStack_30->pNextTo) {
      pSrc = (SrcList *)0x0;
      pItem = (SrcList_item *)0x0;
      if (((pFStack_30->isDeferred != '\0') || (pTab_local[3].pSchema != (Schema *)0x0)) ||
         (*(char *)((long)&pTab_local->pFKey + 3) != '\0')) {
        iVar2 = sqlite3FkLocateIndex
                          ((Parse *)pTab_local,_regNew_local,pFStack_30,(Index **)&pSrc,
                           (int **)&pItem);
        if (iVar2 == 0) {
          pSrc_00 = sqlite3SrcListAppend((sqlite3 *)pFKey,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
          aiCol_1 = (int *)pSrc_00;
          if (pSrc_00 != (SrcList *)0x0) {
            pSrc_00->a[0].pTab = pFStack_30->pFrom;
            pSrc_00->a[0].zName = pFStack_30->pFrom->zName;
            pTVar1 = pSrc_00->a[0].pTab;
            pTVar1->nRef = pTVar1->nRef + 1;
            iVar2 = *(int *)((long)&pTab_local->azModuleArg + 4);
            *(int *)((long)&pTab_local->azModuleArg + 4) = iVar2 + 1;
            pSrc_00->a[0].iCursor = iVar2;
            if ((int)db != 0) {
              fkScanChildren((Parse *)pTab_local,pSrc_00,_regNew_local,(Index *)pSrc,pFStack_30,
                             (int *)pItem,(int)db,-1);
            }
            if (db._4_4_ != 0) {
              fkScanChildren((Parse *)pTab_local,(SrcList *)aiCol_1,_regNew_local,(Index *)pSrc,
                             pFStack_30,(int *)pItem,db._4_4_,1);
            }
            pSrc_00->a[0].zName = (char *)0x0;
            sqlite3SrcListDelete((sqlite3 *)pFKey,(SrcList *)aiCol_1);
          }
          sqlite3DbFree((sqlite3 *)pFKey,pItem);
        }
        else {
          if (pTo._4_4_ == 0) {
            return;
          }
          if (*(char *)&pFKey[1].pFrom != '\0') {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkCheck(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Row is being deleted from this table */ 
  int regOld,                     /* Previous row data is stored here */
  int regNew                      /* New row data is stored here */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  FKey *pFKey;                    /* Used to iterate through FKs */
  int iDb;                        /* Index of database containing pTab */
  const char *zDb;                /* Name of database containing pTab */
  int isIgnoreErrors = pParse->disableTriggers;

  /* Exactly one of regOld and regNew should be non-zero. */
  assert( (regOld==0)!=(regNew==0) );

  /* If foreign-keys are disabled, this function is a no-op. */
  if( (db->flags&SQLITE_ForeignKeys)==0 ) return;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  zDb = db->aDb[iDb].zName;

  /* Loop through all the foreign key constraints for which pTab is the
  ** child table (the table that the foreign key definition is part of).  */
  for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
    Table *pTo;                   /* Parent table of foreign key pFKey */
    Index *pIdx = 0;              /* Index on key columns in pTo */
    int *aiFree = 0;
    int *aiCol;
    int iCol;
    int i;
    int isIgnore = 0;

    /* Find the parent table of this foreign key. Also find a unique index 
    ** on the parent key columns in the parent table. If either of these 
    ** schema items cannot be located, set an error in pParse and return 
    ** early.  */
    if( pParse->disableTriggers ){
      pTo = sqlite3FindTable(db, pFKey->zTo, zDb);
    }else{
      pTo = sqlite3LocateTable(pParse, 0, pFKey->zTo, zDb);
    }
    if( !pTo || sqlite3FkLocateIndex(pParse, pTo, pFKey, &pIdx, &aiFree) ){
      assert( isIgnoreErrors==0 || (regOld!=0 && regNew==0) );
      if( !isIgnoreErrors || db->mallocFailed ) return;
      if( pTo==0 ){
        /* If isIgnoreErrors is true, then a table is being dropped. In this
        ** case SQLite runs a "DELETE FROM xxx" on the table being dropped
        ** before actually dropping it in order to check FK constraints.
        ** If the parent table of an FK constraint on the current table is
        ** missing, behave as if it is empty. i.e. decrement the relevant
        ** FK counter for each row of the current table with non-NULL keys.
        */
        Vdbe *v = sqlite3GetVdbe(pParse);
        int iJump = sqlite3VdbeCurrentAddr(v) + pFKey->nCol + 1;
        for(i=0; i<pFKey->nCol; i++){
          int iReg = pFKey->aCol[i].iFrom + regOld + 1;
          sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iJump);
        }
        sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, -1);
      }
      continue;
    }
    assert( pFKey->nCol==1 || (aiFree && pIdx) );

    if( aiFree ){
      aiCol = aiFree;
    }else{
      iCol = pFKey->aCol[0].iFrom;
      aiCol = &iCol;
    }
    for(i=0; i<pFKey->nCol; i++){
      if( aiCol[i]==pTab->iPKey ){
        aiCol[i] = -1;
      }
#ifndef SQLITE_OMIT_AUTHORIZATION
      /* Request permission to read the parent key columns. If the 
      ** authorization callback returns SQLITE_IGNORE, behave as if any
      ** values read from the parent table are NULL. */
      if( db->xAuth ){
        int rcauth;
        char *zCol = pTo->aCol[pIdx ? pIdx->aiColumn[i] : pTo->iPKey].zName;
        rcauth = sqlite3AuthReadCol(pParse, pTo->zName, zCol, iDb);
        isIgnore = (rcauth==SQLITE_IGNORE);
      }
#endif
    }

    /* Take a shared-cache advisory read-lock on the parent table. Allocate 
    ** a cursor to use to search the unique index on the parent key columns 
    ** in the parent table.  */
    sqlite3TableLock(pParse, iDb, pTo->tnum, 0, pTo->zName);
    pParse->nTab++;

    if( regOld!=0 ){
      /* A row is being removed from the child table. Search for the parent.
      ** If the parent does not exist, removing the child row resolves an 
      ** outstanding foreign key constraint violation. */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regOld, -1,isIgnore);
    }
    if( regNew!=0 ){
      /* A row is being added to the child table. If a parent row cannot
      ** be found, adding the child row has violated the FK constraint. */ 
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regNew, +1,isIgnore);
    }

    sqlite3DbFree(db, aiFree);
  }

  /* Loop through all the foreign key constraints that refer to this table */
  for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
    Index *pIdx = 0;              /* Foreign key index for pFKey */
    SrcList *pSrc;
    int *aiCol = 0;

    if( !pFKey->isDeferred && !pParse->pToplevel && !pParse->isMultiWrite ){
      assert( regOld==0 && regNew!=0 );
      /* Inserting a single row into a parent table cannot cause an immediate
      ** foreign key violation. So do nothing in this case.  */
      continue;
    }

    if( sqlite3FkLocateIndex(pParse, pTab, pFKey, &pIdx, &aiCol) ){
      if( !isIgnoreErrors || db->mallocFailed ) return;
      continue;
    }
    assert( aiCol || pFKey->nCol==1 );

    /* Create a SrcList structure containing a single table (the table 
    ** the foreign key that refers to this table is attached to). This
    ** is required for the sqlite3WhereXXX() interface.  */
    pSrc = sqlite3SrcListAppend(db, 0, 0, 0);
    if( pSrc ){
      struct SrcList_item *pItem = pSrc->a;
      pItem->pTab = pFKey->pFrom;
      pItem->zName = pFKey->pFrom->zName;
      pItem->pTab->nRef++;
      pItem->iCursor = pParse->nTab++;
  
      if( regNew!=0 ){
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regNew, -1);
      }
      if( regOld!=0 ){
        /* If there is a RESTRICT action configured for the current operation
        ** on the parent table of this FK, then throw an exception 
        ** immediately if the FK constraint is violated, even if this is a
        ** deferred trigger. That's what RESTRICT means. To defer checking
        ** the constraint, the FK should specify NO ACTION (represented
        ** using OE_None). NO ACTION is the default.  */
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regOld, 1);
      }
      pItem->zName = 0;
      sqlite3SrcListDelete(db, pSrc);
    }
    sqlite3DbFree(db, aiCol);
  }
}